

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
::Visit<google::protobuf::FieldDescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
           *this,FieldDescriptor *descriptor,FieldDescriptorProto *proto)

{
  string *psVar1;
  bool bVar2;
  OptionTargetType unaff_EBX;
  undefined1 *this_00;
  string_view file_name;
  
  this_00 = (undefined1 *)descriptor->proto_features_;
  if ((FeatureSet *)this_00 == (FeatureSet *)0x0) {
    this_00 = _FieldOptions_default_instance_;
  }
  psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
  file_name._M_str = (char *)0x4;
  file_name._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
  bVar2 = compiler::anon_unknown_5::ValidateTargetConstraints
                    ((anon_unknown_5 *)this_00,
                     (Message *)
                     (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ,(DescriptorPool *)
                      &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t).
                        super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                       ._M_head_impl)->super_ErrorCollector,
                     (ErrorCollector *)psVar1->_M_string_length,file_name,unaff_EBX);
  if (!bVar2) {
    *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
  }
  return;
}

Assistant:

void Visit(const FieldDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
  }